

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O0

void __thiscall crnlib::crn_comp::optimize_alpha(crn_comp *this)

{
  undefined4 uVar1;
  uint uVar2;
  endpoint_indices_details *peVar3;
  uint *puVar4;
  unpacked_endpoint *puVar5;
  optimize_alpha_params *poVar6;
  task_pool *this_00;
  long in_RDI;
  uint i_3;
  uint best_bits;
  optimize_alpha_params *pParams;
  uint i_2;
  float weights [4];
  result remapping_trial [4];
  uint16 i_1;
  vector<crnlib::optimize_alpha_params::unpacked_endpoint> unpacked_endpoints;
  uint16 i;
  uint best_sum;
  uint16 selected;
  uint b;
  uint i1_prev;
  uint i0_prev;
  uint i1;
  uint i0;
  bool hasAlpha1;
  bool hasAlpha0;
  vector<unsigned_int> sum;
  vector<unsigned_int> hist;
  uint16 n;
  undefined4 in_stack_fffffffffffffd78;
  uint in_stack_fffffffffffffd7c;
  vector<crnlib::optimize_alpha_params::unpacked_endpoint> *in_stack_fffffffffffffd80;
  result *this_01;
  result *in_stack_fffffffffffffd90;
  uint64 in_stack_fffffffffffffd98;
  task_pool *in_stack_fffffffffffffda0;
  crn_comp *in_stack_fffffffffffffdb0;
  result *local_218;
  uint local_150;
  uint local_14c;
  uint local_12c;
  float local_128 [4];
  result local_118 [4];
  result rStack_78;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  byte local_3e;
  byte local_3d;
  vector<unsigned_int> local_30;
  vector<unsigned_int> local_20;
  ushort local_a;
  
  uVar2 = vector<unsigned_int>::size((vector<unsigned_int> *)(in_RDI + 0x1500));
  local_a = (ushort)uVar2;
  vector<unsigned_int>::vector
            ((vector<unsigned_int> *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c);
  vector<unsigned_int>::vector
            ((vector<unsigned_int> *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c);
  local_3d = *(byte *)(in_RDI + 0x14d1) & 1;
  local_3e = *(byte *)(in_RDI + 0x14d2) & 1;
  local_4c = 0;
  local_50 = 0;
  for (rStack_78._36_4_ = 0; uVar1 = rStack_78._36_4_,
      uVar2 = vector<crnlib::dxt_hc::endpoint_indices_details>::size
                        ((vector<crnlib::dxt_hc::endpoint_indices_details> *)(in_RDI + 0x1530)),
      (uint)uVar1 < uVar2; rStack_78._36_4_ = rStack_78._36_4_ + 1) {
    peVar3 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                       ((vector<crnlib::dxt_hc::endpoint_indices_details> *)(in_RDI + 0x1530),
                        rStack_78._36_4_);
    local_44 = (uint)(peVar3->field_0).field_0.alpha0;
    peVar3 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                       ((vector<crnlib::dxt_hc::endpoint_indices_details> *)(in_RDI + 0x1530),
                        rStack_78._36_4_);
    local_48 = (uint)(peVar3->field_0).field_0.alpha1;
    peVar3 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                       ((vector<crnlib::dxt_hc::endpoint_indices_details> *)(in_RDI + 0x1530),
                        rStack_78._36_4_);
    if (peVar3->reference == '\0') {
      if (((local_3d & 1) != 0) && (local_44 != local_4c)) {
        puVar4 = vector<unsigned_int>::operator[](&local_20,local_44 * local_a + local_4c);
        *puVar4 = *puVar4 + 1;
        puVar4 = vector<unsigned_int>::operator[](&local_20,local_4c * local_a + local_44);
        *puVar4 = *puVar4 + 1;
        puVar4 = vector<unsigned_int>::operator[](&local_30,local_44);
        *puVar4 = *puVar4 + 1;
        puVar4 = vector<unsigned_int>::operator[](&local_30,local_4c);
        *puVar4 = *puVar4 + 1;
      }
      if (((local_3e & 1) != 0) && (local_48 != local_50)) {
        puVar4 = vector<unsigned_int>::operator[](&local_20,local_48 * local_a + local_50);
        *puVar4 = *puVar4 + 1;
        puVar4 = vector<unsigned_int>::operator[](&local_20,local_50 * local_a + local_48);
        *puVar4 = *puVar4 + 1;
        puVar4 = vector<unsigned_int>::operator[](&local_30,local_48);
        *puVar4 = *puVar4 + 1;
        puVar4 = vector<unsigned_int>::operator[](&local_30,local_50);
        *puVar4 = *puVar4 + 1;
      }
    }
    local_4c = local_44;
    local_50 = local_48;
  }
  rStack_78.total_bits._2_2_ = 0;
  rStack_78.packed_endpoints.m_capacity = 0;
  for (rStack_78.packed_endpoints.m_size._2_2_ = 0; uVar2 = rStack_78.packed_endpoints.m_capacity,
      rStack_78.packed_endpoints.m_size._2_2_ < local_a;
      rStack_78.packed_endpoints.m_size._2_2_ = rStack_78.packed_endpoints.m_size._2_2_ + 1) {
    puVar4 = vector<unsigned_int>::operator[]
                       (&local_30,(uint)rStack_78.packed_endpoints.m_size._2_2_);
    if (uVar2 < *puVar4) {
      puVar4 = vector<unsigned_int>::operator[]
                         (&local_30,(uint)rStack_78.packed_endpoints.m_size._2_2_);
      rStack_78.packed_endpoints.m_capacity = *puVar4;
      rStack_78.total_bits._2_2_ = rStack_78.packed_endpoints.m_size._2_2_;
    }
  }
  vector<crnlib::optimize_alpha_params::unpacked_endpoint>::vector
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c);
  for (rStack_78.endpoint_remapping.m_p._6_2_ = 0; rStack_78.endpoint_remapping.m_p._6_2_ < local_a;
      rStack_78.endpoint_remapping.m_p._6_2_ = rStack_78.endpoint_remapping.m_p._6_2_ + 1) {
    puVar4 = vector<unsigned_int>::operator[]
                       ((vector<unsigned_int> *)(in_RDI + 0x1500),
                        (uint)rStack_78.endpoint_remapping.m_p._6_2_);
    uVar2 = dxt5_block::unpack_endpoint(*puVar4,0);
    puVar5 = vector<crnlib::optimize_alpha_params::unpacked_endpoint>::operator[]
                       ((vector<crnlib::optimize_alpha_params::unpacked_endpoint> *)
                        &rStack_78.endpoint_remapping.m_size,
                        (uint)rStack_78.endpoint_remapping.m_p._6_2_);
    puVar5->low = (uint8)uVar2;
    puVar4 = vector<unsigned_int>::operator[]
                       ((vector<unsigned_int> *)(in_RDI + 0x1500),
                        (uint)rStack_78.endpoint_remapping.m_p._6_2_);
    uVar2 = dxt5_block::unpack_endpoint(*puVar4,1);
    puVar5 = vector<crnlib::optimize_alpha_params::unpacked_endpoint>::operator[]
                       ((vector<crnlib::optimize_alpha_params::unpacked_endpoint> *)
                        &rStack_78.endpoint_remapping.m_size,
                        (uint)rStack_78.endpoint_remapping.m_p._6_2_);
    puVar5->high = (uint8)uVar2;
  }
  local_218 = local_118;
  do {
    optimize_alpha_params::result::result(in_stack_fffffffffffffd90);
    local_218 = local_218 + 1;
  } while (local_218 != &rStack_78);
  local_128[0] = 0.0;
  local_128[1] = 0.0;
  local_128[2] = 0.16666667;
  local_128[3] = 0.5;
  for (local_12c = 0; local_12c < 4; local_12c = local_12c + 1) {
    poVar6 = crnlib_new<crnlib::optimize_alpha_params>();
    puVar5 = vector<crnlib::optimize_alpha_params::unpacked_endpoint>::get_ptr
                       ((vector<crnlib::optimize_alpha_params::unpacked_endpoint> *)
                        &rStack_78.endpoint_remapping.m_size);
    poVar6->unpacked_endpoints = puVar5;
    this_00 = (task_pool *)vector<unsigned_int>::get_ptr(&local_20);
    poVar6->hist = (uint *)this_00;
    poVar6->n = local_a;
    poVar6->selected = rStack_78.total_bits._2_2_;
    poVar6->weight = local_128[local_12c];
    poVar6->pResult = local_118 + local_12c;
    task_pool::
    queue_object_task<crnlib::crn_comp,void(crnlib::crn_comp::*)(unsigned_long_long,void*)>
              (this_00,in_stack_fffffffffffffdb0,
               (offset_in_crn_comp_to_subr)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               in_stack_fffffffffffffd90);
  }
  task_pool::join(in_stack_fffffffffffffda0);
  local_14c = 0xffffffff;
  for (local_150 = 0; local_150 < 4; local_150 = local_150 + 1) {
    if (local_118[local_150].total_bits < local_14c) {
      vector<unsigned_char>::swap
                ((vector<unsigned_char> *)in_stack_fffffffffffffd80,
                 (vector<unsigned_char> *)
                 CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      vector<unsigned_short>::swap
                ((vector<unsigned_short> *)in_stack_fffffffffffffd80,
                 (vector<unsigned_short> *)
                 CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      local_14c = local_118[local_150].total_bits;
    }
  }
  this_01 = &rStack_78;
  do {
    this_01 = this_01 + -1;
    optimize_alpha_params::result::~result(this_01);
  } while (this_01 != local_118);
  vector<crnlib::optimize_alpha_params::unpacked_endpoint>::~vector
            ((vector<crnlib::optimize_alpha_params::unpacked_endpoint> *)this_01);
  vector<unsigned_int>::~vector((vector<unsigned_int> *)this_01);
  vector<unsigned_int>::~vector((vector<unsigned_int> *)this_01);
  return;
}

Assistant:

void crn_comp::optimize_alpha() {
  uint16 n = m_alpha_endpoints.size();
  crnlib::vector<uint> hist(n * n);
  crnlib::vector<uint> sum(n);
  bool hasAlpha0 = m_has_comp[cAlpha0], hasAlpha1 = m_has_comp[cAlpha1];
  for (uint i0, i1, i0_prev = 0, i1_prev = 0, b = 0; b < m_endpoint_indices.size(); b++, i0_prev = i0, i1_prev = i1) {
    i0 = m_endpoint_indices[b].alpha0;
    i1 = m_endpoint_indices[b].alpha1;    
    if (!m_endpoint_indices[b].reference) {
      if (hasAlpha0 && i0 != i0_prev) {
        hist[i0 * n + i0_prev]++;
        hist[i0_prev * n + i0]++;
        sum[i0]++;
        sum[i0_prev]++;
      }
      if (hasAlpha1 && i1 != i1_prev) {
        hist[i1 * n + i1_prev]++;
        hist[i1_prev * n + i1]++;
        sum[i1]++;
        sum[i1_prev]++;
      }
    }
  }
  uint16 selected = 0;
  uint best_sum = 0;
  for (uint16 i = 0; i < n; i++) {
    if (best_sum < sum[i]) {
      best_sum = sum[i];
      selected = i;
    }
  }
  crnlib::vector<optimize_alpha_params::unpacked_endpoint> unpacked_endpoints(n);
  for (uint16 i = 0; i < n; i++) {
    unpacked_endpoints[i].low = dxt5_block::unpack_endpoint(m_alpha_endpoints[i], 0);
    unpacked_endpoints[i].high = dxt5_block::unpack_endpoint(m_alpha_endpoints[i], 1);
  }

  optimize_alpha_params::result remapping_trial[4];
  float weights[4] = {0, 0, 1.0f / 6.0f, 0.5f};
  for (uint i = 0; i < 4; i++) {
    optimize_alpha_params* pParams = crnlib_new<optimize_alpha_params>();
    pParams->unpacked_endpoints = unpacked_endpoints.get_ptr();
    pParams->hist = hist.get_ptr();
    pParams->n = n;
    pParams->selected = selected;
    pParams->weight = weights[i];
    pParams->pResult = remapping_trial + i;
    m_task_pool.queue_object_task(this, &crn_comp::optimize_alpha_endpoints_task, i, pParams);
  }
  m_task_pool.join();

  for (uint best_bits = cUINT32_MAX, i = 0; i < 4; i++) {
    if (remapping_trial[i].total_bits < best_bits) {
      m_packed_alpha_endpoints.swap(remapping_trial[i].packed_endpoints);
      m_endpoint_remaping[cAlpha0].swap(remapping_trial[i].endpoint_remapping);
      best_bits = remapping_trial[i].total_bits;
    }
  }
}